

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::LdexpCase::getInputValues(LdexpCase *this,int numValues,void **values)

{
  float fVar1;
  float fVar2;
  Precision PVar3;
  pointer pSVar4;
  void *pvVar5;
  void *pvVar6;
  deUint32 dVar7;
  uint uVar8;
  int iVar9;
  deBool dVar10;
  deUint32 dVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  bool bVar22;
  deUint32 u32;
  float fVar23;
  Random rnd;
  Vec2 ranges [3];
  deRandom local_58;
  float local_48 [6];
  
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -1000.0;
  local_48[3] = 1000.0;
  local_48[4] = -1e+07;
  local_48[5] = 1e+07;
  dVar7 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_58,dVar7 ^ 0x2790a);
  pSVar4 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar3 = (pSVar4->varType).m_data.basic.precision;
  uVar8 = glu::getDataTypeScalarSize((pSVar4->varType).m_data.basic.type);
  uVar12 = (ulong)uVar8;
  iVar9 = 0;
  uVar14 = 0;
  do {
    uVar20 = (&DAT_01c959c0)[uVar14];
    if (uVar14 < 2) {
      uVar15 = uVar20 & 0x80000000;
      iVar18 = 0;
    }
    else {
      uVar15 = uVar20 & 0x807fffff | 0x3f000000;
      iVar17 = (uVar20 >> 0x17 & 0xff) - 0x7e;
      iVar18 = iVar17;
      if ((uVar20 & 0x7fffff) != 0) {
        iVar18 = -0x7d;
      }
      if ((uVar20 & 0x7f800000) != 0) {
        iVar18 = iVar17;
      }
    }
    if (0 < (int)uVar8) {
      pvVar5 = *values;
      pvVar6 = values[1];
      uVar16 = uVar12;
      iVar17 = iVar9;
      do {
        *(uint *)((long)pvVar5 + (long)iVar17 * 4) = uVar15;
        *(int *)((long)pvVar6 + (long)iVar17 * 4) = iVar18;
        iVar17 = iVar17 + 1;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    uVar14 = uVar14 + 1;
    iVar9 = iVar9 + uVar8;
  } while (uVar14 != 8);
  iVar9 = 0x32;
  if (PVar3 != PRECISION_HIGHP) {
    iVar9 = numValues + -8;
  }
  if (iVar9 < 1) {
    iVar18 = 8;
  }
  else {
    iVar19 = uVar8 * 8;
    iVar17 = 8;
    do {
      if (0 < (int)uVar8) {
        fVar1 = local_48[(ulong)PVar3 * 2];
        fVar2 = local_48[(ulong)PVar3 * 2 + 1];
        uVar14 = uVar12;
        iVar18 = iVar19;
        do {
          fVar23 = deRandom_getFloat(&local_58);
          fVar23 = fVar23 * (fVar2 - fVar1) + fVar1;
          if ((fVar23 != 0.0) || (NAN(fVar23))) {
            uVar20 = (uint)fVar23 & 0x807fffff | 0x3f000000;
            iVar13 = ((uint)fVar23 >> 0x17 & 0xff) - 0x7e;
            iVar21 = iVar13;
            if (((uint)fVar23 & 0x7fffff) != 0) {
              iVar21 = -0x7d;
            }
            if (((uint)fVar23 & 0x7f800000) != 0) {
              iVar21 = iVar13;
            }
          }
          else {
            uVar20 = (uint)fVar23 & 0x80000000;
            iVar21 = 0;
          }
          *(uint *)((long)*values + (long)iVar18 * 4) = uVar20;
          *(int *)((long)values[1] + (long)iVar18 * 4) = iVar21;
          iVar18 = iVar18 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      iVar18 = iVar17 + 1;
      iVar19 = iVar19 + uVar8;
      bVar22 = iVar17 != iVar9 + 7;
      iVar17 = iVar18;
    } while (bVar22);
  }
  if (0 < numValues - iVar18) {
    iVar9 = uVar8 * iVar18;
    do {
      uVar14 = uVar12;
      iVar17 = iVar9;
      if (0 < (int)uVar8) {
        do {
          dVar7 = deRandom_getUint32(&local_58);
          uVar20 = dVar7 >> 1;
          iVar21 = uVar20 / 0x7f + uVar20 / 0x7f + (uVar20 / 0x7f) * -0x100 + dVar7;
          dVar10 = deRandom_getBool(&local_58);
          dVar7 = deRandom_getUint32(&local_58);
          iVar19 = -iVar21;
          if (-iVar21 < -0x7d) {
            iVar19 = -0x7e;
          }
          iVar13 = 0xfd - iVar21;
          if (0x7e < 0xfd - iVar21) {
            iVar13 = 0x7f;
          }
          dVar11 = deRandom_getUint32(&local_58);
          *(uint *)((long)*values + (long)iVar17 * 4) =
               iVar21 * 0x800000 + ((uint)(dVar10 == 1) << 0x1f | dVar7 & 0x7fffff) + 0x800000;
          *(uint *)((long)values[1] + (long)iVar17 * 4) = dVar11 % ((iVar13 - iVar19) + 1U) + iVar19
          ;
          iVar17 = iVar17 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      iVar18 = iVar18 + 1;
      iVar9 = iVar9 + uVar8;
    } while (iVar18 != numValues);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd					(deStringHash(getName()) ^ 0x2790au);
		const glu::DataType		type				= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision			= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize			= glu::getDataTypeScalarSize(type);
		int						valueNdx			= 0;

		{
			const float easySpecialCases[] = { 0.0f, -0.0f, 0.5f, -0.5f, 1.0f, -1.0f, 2.0f, -2.0f };

			DE_ASSERT(valueNdx + DE_LENGTH_OF_ARRAY(easySpecialCases) <= numValues);
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(easySpecialCases); caseNdx++)
			{
				float	in0;
				int		in1;

				frexp(easySpecialCases[caseNdx], &in0, &in1);

				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}

		{
			// \note lowp and mediump can not necessarily fit the values in hard cases, so we'll use only easy ones.
			const int numEasyRandomCases = precision == glu::PRECISION_HIGHP ? 50 : (numValues-valueNdx);

			DE_ASSERT(valueNdx + numEasyRandomCases <= numValues);
			for (int caseNdx = 0; caseNdx < numEasyRandomCases; caseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					const float	in	= rnd.getFloat(ranges[precision].x(), ranges[precision].y());
					float		in0;
					int			in1;

					frexp(in, &in0, &in1);

					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}

		{
			const int numHardRandomCases = numValues-valueNdx;
			DE_ASSERT(numHardRandomCases >= 0 && valueNdx + numHardRandomCases <= numValues);

			for (int caseNdx = 0; caseNdx < numHardRandomCases; caseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					const int		fpExp		= rnd.getInt(-126, 127);
					const int		sign		= rnd.getBool() ? -1 : +1;
					const deUint32	mantissa	= (1u<<23) | (rnd.getUint32() & ((1u<<23)-1));
					const int		in1			= rnd.getInt(de::max(-126, -126-fpExp), de::min(127, 127-fpExp));
					const float		in0			= tcu::Float32::construct(sign, fpExp, mantissa).asFloat();

					DE_ASSERT(de::inRange(in1, -126, 127)); // See Khronos bug 11180
					DE_ASSERT(de::inRange(in1+fpExp, -126, 127));

					const float		out			= ldexp(in0, in1);

					DE_ASSERT(!tcu::Float32(out).isInf() && !tcu::Float32(out).isDenorm());
					DE_UNREF(out);

					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}
	}